

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::Clear(Value_ImmediateValue *this)

{
  uint32_t cached_has_bits;
  Value_ImmediateValue *this_local;
  
  clear_value(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Value_ImmediateValue::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Value.ImmediateValue)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  clear_value();
  _internal_metadata_.Clear<std::string>();
}